

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O0

UINT32 NES_DMC_np_Render(void *chip,INT32 *b)

{
  UINT32 UVar1;
  int iVar2;
  UINT32 local_48;
  UINT32 local_44;
  UINT32 local_40;
  int local_3c;
  int i;
  INT32 voltage;
  INT32 ref;
  INT32 m [3];
  UINT32 clocks;
  NES_DMC *dmc;
  INT32 *b_local;
  void *chip_local;
  
  unique0x100005b2 = (NES_DMC *)chip;
  RC_STEP((RATIO_CNTR *)((long)chip + 0x40118));
  m[1] = RC_GET_VAL(&stack0xffffffffffffffe0->tick_count);
  RC_MASK(&stack0xffffffffffffffe0->tick_count);
  TickFrameSequence(stack0xffffffffffffffe0,m[1]);
  Tick(stack0xffffffffffffffe0,m[1]);
  if ((stack0xffffffffffffffe0->mask & 1U) == 0) {
    local_40 = stack0xffffffffffffffe0->out[0];
  }
  else {
    local_40 = 0;
  }
  stack0xffffffffffffffe0->out[0] = local_40;
  if ((stack0xffffffffffffffe0->mask & 2U) == 0) {
    local_44 = stack0xffffffffffffffe0->out[1];
  }
  else {
    local_44 = 0;
  }
  stack0xffffffffffffffe0->out[1] = local_44;
  if ((stack0xffffffffffffffe0->mask & 4U) == 0) {
    local_48 = stack0xffffffffffffffe0->out[2];
  }
  else {
    local_48 = 0;
  }
  stack0xffffffffffffffe0->out[2] = local_48;
  voltage = stack0xffffffffffffffe0->tnd_table[0][stack0xffffffffffffffe0->out[0]][0][0];
  ref = stack0xffffffffffffffe0->tnd_table[0][0][stack0xffffffffffffffe0->out[1]][0];
  m[0] = stack0xffffffffffffffe0->tnd_table[0][0][0][stack0xffffffffffffffe0->out[2]];
  if (stack0xffffffffffffffe0->option[1] != 0) {
    iVar2 = voltage + ref + m[0];
    UVar1 = stack0xffffffffffffffe0->tnd_table[1][stack0xffffffffffffffe0->out[0]]
            [stack0xffffffffffffffe0->out[1]][stack0xffffffffffffffe0->out[2]];
    if (iVar2 == 0) {
      for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
        (&voltage)[local_3c] = UVar1;
      }
    }
    else {
      for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
        (&voltage)[local_3c] = (int)((&voltage)[local_3c] * UVar1) / iVar2;
      }
    }
  }
  if (stack0xffffffffffffffe0->option[4] != 0) {
    if (stack0xffffffffffffffe0->dmc_pop != false) {
      stack0xffffffffffffffe0->dmc_pop_offset =
           (stack0xffffffffffffffe0->dmc_pop_follow - m[0]) +
           stack0xffffffffffffffe0->dmc_pop_offset;
      stack0xffffffffffffffe0->dmc_pop = false;
      if (0x3ffc0000 < stack0xffffffffffffffe0->dmc_pop_offset) {
        stack0xffffffffffffffe0->dmc_pop_offset = 0x3ffc0000;
      }
      if (stack0xffffffffffffffe0->dmc_pop_offset < -0x3ffc0000) {
        stack0xffffffffffffffe0->dmc_pop_offset = -0x3ffc0000;
      }
    }
    stack0xffffffffffffffe0->dmc_pop_follow = m[0];
    m[0] = stack0xffffffffffffffe0->dmc_pop_offset + m[0];
    if (stack0xffffffffffffffe0->dmc_pop_offset < 1) {
      if (stack0xffffffffffffffe0->dmc_pop_offset < 0) {
        stack0xffffffffffffffe0->dmc_pop_offset = stack0xffffffffffffffe0->dmc_pop_offset + 1;
      }
    }
    else {
      stack0xffffffffffffffe0->dmc_pop_offset = stack0xffffffffffffffe0->dmc_pop_offset + -1;
    }
  }
  *b = voltage * stack0xffffffffffffffe0->sm[0][0];
  *b = ref * stack0xffffffffffffffe0->sm[0][1] + *b;
  *b = -m[0] * stack0xffffffffffffffe0->sm[0][2] + *b;
  *b = *b >> 5;
  b[1] = voltage * stack0xffffffffffffffe0->sm[1][0];
  b[1] = ref * stack0xffffffffffffffe0->sm[1][1] + b[1];
  b[1] = -m[0] * stack0xffffffffffffffe0->sm[1][2] + b[1];
  b[1] = b[1] >> 5;
  return 2;
}

Assistant:

UINT32 NES_DMC_np_Render(void* chip, INT32 b[2])
{
	NES_DMC* dmc = (NES_DMC*)chip;
	UINT32 clocks;
	INT32 m[3];

	RC_STEP(&dmc->tick_count);
	clocks = RC_GET_VAL(&dmc->tick_count);
	RC_MASK(&dmc->tick_count);
	TickFrameSequence(dmc, clocks);
	Tick(dmc, clocks);

	dmc->out[0] = (dmc->mask & 1) ? 0 : dmc->out[0];
	dmc->out[1] = (dmc->mask & 2) ? 0 : dmc->out[1];
	dmc->out[2] = (dmc->mask & 4) ? 0 : dmc->out[2];

	m[0] = dmc->tnd_table[0][dmc->out[0]][0][0];
	m[1] = dmc->tnd_table[0][0][dmc->out[1]][0];
	m[2] = dmc->tnd_table[0][0][0][dmc->out[2]];

	if (dmc->option[OPT_NONLINEAR_MIXER])
	{
		INT32 ref = m[0] + m[1] + m[2];
		INT32 voltage = dmc->tnd_table[1][dmc->out[0]][dmc->out[1]][dmc->out[2]];
		int i;
		if (ref)
		{
			for (i=0; i < 3; ++i)
				m[i] = (m[i] * voltage) / ref;
		}
		else
		{
			for (i=0; i < 3; ++i)
				m[i] = voltage;
		}
	}

	// anti-click nullifies any 4011 write but preserves nonlinearity
	if (dmc->option[OPT_DPCM_ANTI_CLICK])
	{
		if (dmc->dmc_pop) // $4011 will cause pop this frame
		{
			// adjust offset to counteract pop
			dmc->dmc_pop_offset += dmc->dmc_pop_follow - m[2];
			dmc->dmc_pop = false;

			// prevent overflow, keep headspace at edges
			//const INT32 OFFSET_MAX = (1 << 30) - (4 << 16);
#define OFFSET_MAX	((1 << 30) - (4 << 16))
			if (dmc->dmc_pop_offset >  OFFSET_MAX) dmc->dmc_pop_offset =  OFFSET_MAX;
			if (dmc->dmc_pop_offset < -OFFSET_MAX) dmc->dmc_pop_offset = -OFFSET_MAX;
		}
		dmc->dmc_pop_follow = m[2]; // remember previous position

		m[2] += dmc->dmc_pop_offset; // apply offset

		// TODO implement this in a better way
		// roll off offset (not ideal, but prevents overflow)
		if (dmc->dmc_pop_offset > 0) --dmc->dmc_pop_offset;
		else if (dmc->dmc_pop_offset < 0) ++dmc->dmc_pop_offset;
	}

	b[0]  = m[0] * dmc->sm[0][0];
	b[0] += m[1] * dmc->sm[0][1];
	b[0] +=-m[2] * dmc->sm[0][2];
	b[0] >>= 7-2;

	b[1]  = m[0] * dmc->sm[1][0];
	b[1] += m[1] * dmc->sm[1][1];
	b[1] +=-m[2] * dmc->sm[1][2];
	b[1] >>= 7-2;

	return 2;
}